

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<void_()>::UntypedPerformAction
          (FunctionMocker<void_()> *this,void *untyped_action,void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  Action<void_()> action;
  _Any_data _Stack_28;
  _Manager_type local_18;
  
  std::function<void_()>::function
            ((function<void_()> *)&_Stack_28,(function<void_()> *)untyped_action);
  Action<void_()>::Perform((Action<void_()> *)&_Stack_28);
  pUVar1 = (UntypedActionResultHolderBase *)operator_new(8);
  pUVar1->_vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001942c8;
  if (local_18 != (code *)0x0) {
    (*local_18)(&_Stack_28,&_Stack_28,__destroy_functor);
  }
  return pUVar1;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }